

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

UnknownField __thiscall google::protobuf::UnknownField::DeepCopy(UnknownField *this,Arena *arena)

{
  undefined4 uVar1;
  undefined4 uVar4;
  string *psVar2;
  pointer pcVar3;
  anon_union_8_5_2195ba05_for_data_ this_00;
  UnknownField UVar5;
  
  uVar1 = this->number_;
  uVar4 = this->type_;
  UVar5.type_ = uVar4;
  UVar5.number_ = uVar1;
  if (this->type_ == 4) {
    if (arena == (Arena *)0x0) {
      this_00.string_value = (string *)operator_new(0x10);
      ((this_00.string_value)->_M_dataplus)._M_p = (pointer)0x0;
    }
    else {
      this_00.string_value = (string *)Arena::Allocate(arena,0x10);
      internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_00.string_value,arena);
    }
    UnknownFieldSet::MergeFrom(this_00.group,(this->data_).group);
  }
  else if (this->type_ == 3) {
    psVar2 = (this->data_).string_value;
    if (arena == (Arena *)0x0) {
      this_00.string_value = (string *)operator_new(0x20);
      ((this_00.string_value)->_M_dataplus)._M_p = (pointer)&(this_00.string_value)->field_2;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this_00.varint,pcVar3,pcVar3 + psVar2->_M_string_length);
    }
    else {
      this_00.string_value =
           (string *)internal::ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
      ((this_00.string_value)->_M_dataplus)._M_p = (pointer)&(this_00.string_value)->field_2;
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)this_00.varint,pcVar3,pcVar3 + psVar2->_M_string_length);
    }
  }
  else {
    this_00 = (anon_union_8_5_2195ba05_for_data_)(this->data_).varint;
  }
  UVar5.data_.varint = this_00.varint;
  return UVar5;
}

Assistant:

UnknownField UnknownField::DeepCopy(Arena* arena) const {
  UnknownField copy = *this;
  switch (type()) {
    case UnknownField::TYPE_LENGTH_DELIMITED:
      copy.data_.string_value =
          Arena::Create<std::string>(arena, *data_.string_value);
      break;
    case UnknownField::TYPE_GROUP: {
      UnknownFieldSet* group = Arena::Create<UnknownFieldSet>(arena);
      group->MergeFrom(*data_.group);
      copy.data_.group = group;
      break;
    }
    default:
      break;
  }
  return copy;
}